

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O3

TPZGeoEl * TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *Mesh,int64_t ElemIndex,int targetSide)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined4 uVar3;
  int iVar4;
  _Rb_tree_color _Var5;
  TPZGeoEl **ppTVar6;
  TPZGeoEl *pTVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t nelem;
  int64_t nelem_00;
  int64_t nelem_01;
  TPZGeoNode *pTVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  int c;
  int iVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  long lVar16;
  TPZAdmChunkVector<TPZGeoNode,_10> *this;
  int tsNode;
  _Self __tmp;
  TPZGeoElSide targetSideEl;
  set<int,_std::less<int>,_std::allocator<int>_> targetSideNodes_set;
  TPZStack<int,_10> targetSideEdges;
  TPZStack<int,_10> targetSideNodes;
  set<int,_std::less<int>,_std::allocator<int>_> NOTtargetSideEdges_set;
  set<int,_std::less<int>,_std::allocator<int>_> targetSideEdges_set;
  int local_1b0;
  _Rb_tree_color local_1ac;
  TPZGeoEl *local_1a8;
  TPZGeoElSide local_1a0;
  double local_188;
  REAL local_180;
  _func_int **local_178;
  _Rb_tree_node_base *local_170;
  TPZGeoElSide local_168;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_150;
  TPZManVector<int,_10> local_120;
  TPZManVector<int,_10> local_d8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_1b0 = targetSide;
  ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(Mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,ElemIndex);
  pTVar7 = *ppTVar6;
  cVar2 = (**(code **)(*(long *)pTVar7 + 0xd0))(pTVar7);
  if (cVar2 != '\0') {
    pTVar7 = ChangeToQuadratic(Mesh,ElemIndex);
  }
  uVar3 = (**(code **)(*(long *)pTVar7 + 0xb8))(pTVar7);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_d8);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_120);
  switch(uVar3) {
  case 0:
    break;
  case 1:
    pztopology::TPZLine::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_d8,0);
    pztopology::TPZLine::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_120,1);
    break;
  case 2:
    pztopology::TPZTriangle::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_d8,0);
    pztopology::TPZTriangle::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_120,1);
    break;
  case 3:
    pztopology::TPZQuadrilateral::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_d8,0);
    pztopology::TPZQuadrilateral::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_120,1);
    break;
  case 4:
    pztopology::TPZTetrahedron::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_d8,0);
    pztopology::TPZTetrahedron::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_120,1);
    break;
  case 5:
    pztopology::TPZPyramid::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_d8,0);
    pztopology::TPZPyramid::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_120,1);
    break;
  case 6:
    pztopology::TPZPrism::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_d8,0);
    pztopology::TPZPrism::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_120,1);
    break;
  case 7:
    pztopology::TPZCube::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_d8,0);
    pztopology::TPZCube::LowerDimensionSides(local_1b0,(TPZStack<int,_10> *)&local_120,1);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Element type not found on ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "static TPZGeoEl *TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *, int64_t, int)",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzchangeel.cpp"
               ,0x149);
  }
  local_150._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_150._M_impl.super__Rb_tree_header._M_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178 = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_168.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_168.fSide = local_1b0;
  local_1a8 = pTVar7;
  local_168.fGeoEl = pTVar7;
  local_150._M_impl.super__Rb_tree_header._M_header._M_right =
       local_150._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (0 < local_d8.super_TPZVec<int>.fNElements) {
    lVar16 = 0;
    do {
      local_1a0.super_TPZSavable._vptr_TPZSavable._0_4_ = local_d8.super_TPZVec<int>.fStore[lVar16];
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_150,(int *)&local_1a0);
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_d8.super_TPZVec<int>.fNElements);
  }
  iVar4 = TPZGeoElSide::Dimension(&local_168);
  if (iVar4 == 0) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &local_150,&local_1b0);
  }
  if (0 < local_120.super_TPZVec<int>.fNElements) {
    lVar16 = 0;
    do {
      local_1a0.super_TPZSavable._vptr_TPZSavable._0_4_ = local_120.super_TPZVec<int>.fStore[lVar16]
      ;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_1a0);
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_120.super_TPZVec<int>.fNElements);
  }
  iVar4 = TPZGeoElSide::Dimension(&local_168);
  if (iVar4 == 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,&local_1b0);
  }
  _Var5 = (**(code **)(*(long *)local_1a8 + 0x98))();
  while (local_1ac = _Var5, iVar4 = (**(code **)(*(long *)local_1a8 + 0xf0))(), (int)_Var5 < iVar4)
  {
    local_1a0.super_TPZSavable._vptr_TPZSavable = local_178;
    local_1a0.fGeoEl = local_1a8;
    local_1a0.fSide = local_1ac;
    iVar4 = TPZGeoElSide::Dimension(&local_1a0);
    if (iVar4 == 1) {
      p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var15 = &p_Var1->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var14 = p_Var15;
          p_Var12 = p_Var11;
          _Var5 = p_Var12[1]._M_color;
          p_Var15 = p_Var12;
          if ((int)_Var5 < (int)local_1ac) {
            p_Var15 = p_Var14;
          }
          p_Var11 = (&p_Var12->_M_left)[(int)_Var5 < (int)local_1ac];
        } while ((&p_Var12->_M_left)[(int)_Var5 < (int)local_1ac] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var15 != p_Var1) {
          if ((int)_Var5 < (int)local_1ac) {
            p_Var12 = p_Var14;
          }
          if ((int)p_Var12[1]._M_color <= (int)local_1ac) goto LAB_00f87a98;
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_90,(int *)&local_1ac);
    }
    else {
LAB_00f87a98:
      iVar4 = TPZGeoElSide::Dimension(&local_1a0);
      if (1 < iVar4) break;
    }
    _Var5 = local_1ac + _S_black;
  }
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_90._M_impl.super__Rb_tree_header) {
    this = &Mesh->fNodeVec;
    p_Var11 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_1a0.fSide = p_Var11[1]._M_color;
      local_1a0.super_TPZSavable._vptr_TPZSavable = local_178;
      local_1a0.fGeoEl = local_1a8;
      local_170 = p_Var11;
      iVar8 = TPZGeoElSide::SideNodeLocIndex(&local_1a0,0);
      iVar9 = TPZGeoElSide::SideNodeLocIndex(&local_1a0,1);
      nelem = TPZGeoElSide::SideNodeIndex(&local_1a0,0);
      nelem_00 = TPZGeoElSide::SideNodeIndex(&local_1a0,1);
      nelem_01 = (**(code **)(*(long *)local_1a8 + 0xa8))();
      if (local_150._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var11 = &local_150._M_impl.super__Rb_tree_header._M_header;
        p_Var15 = local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          p_Var12 = p_Var15;
          p_Var14 = p_Var11;
          _Var5 = p_Var12[1]._M_color;
          iVar4 = (int)iVar8;
          p_Var11 = p_Var12;
          if ((int)_Var5 < iVar4) {
            p_Var11 = p_Var14;
          }
          p_Var15 = (&p_Var12->_M_left)[(int)_Var5 < iVar4];
        } while ((&p_Var12->_M_left)[(int)_Var5 < iVar4] != (_Base_ptr)0x0);
        iVar13 = (int)iVar9;
        if ((_Rb_tree_header *)p_Var11 != &local_150._M_impl.super__Rb_tree_header) {
          if ((int)_Var5 < iVar4) {
            p_Var12 = p_Var14;
          }
          if ((int)p_Var12[1]._M_color <= iVar4) {
            lVar16 = 0;
            do {
              pTVar10 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                  (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem);
              local_180 = pTVar10->fCoord[lVar16];
              pTVar10 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                  (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_00);
              local_188 = pTVar10->fCoord[lVar16];
              pTVar10 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                  (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_01);
              TPZGeoNode::SetCoord(pTVar10,(int)lVar16,local_180 * 0.75 + local_188 * 0.25);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            goto LAB_00f87cbc;
          }
        }
        p_Var11 = local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 = &local_150._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var14 = p_Var15;
          p_Var12 = p_Var11;
          _Var5 = p_Var12[1]._M_color;
          p_Var15 = p_Var12;
          if ((int)_Var5 < iVar13) {
            p_Var15 = p_Var14;
          }
          p_Var11 = (&p_Var12->_M_left)[(int)_Var5 < iVar13];
        } while ((&p_Var12->_M_left)[(int)_Var5 < iVar13] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var15 != &local_150._M_impl.super__Rb_tree_header) {
          if ((int)_Var5 < iVar13) {
            p_Var12 = p_Var14;
          }
          if ((int)p_Var12[1]._M_color <= iVar13) {
            lVar16 = 0;
            do {
              pTVar10 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                  (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_00);
              local_180 = pTVar10->fCoord[lVar16];
              pTVar10 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                  (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem);
              local_188 = pTVar10->fCoord[lVar16];
              pTVar10 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                  (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_01);
              TPZGeoNode::SetCoord(pTVar10,(int)lVar16,local_180 * 0.75 + local_188 * 0.25);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
          }
        }
      }
LAB_00f87cbc:
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_170);
    } while ((_Rb_tree_header *)p_Var11 != &local_90._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_150);
  TPZManVector<int,_10>::~TPZManVector(&local_120);
  TPZManVector<int,_10>::~TPZManVector(&local_d8);
  return local_1a8;
}

Assistant:

TPZGeoEl* TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *Mesh, int64_t ElemIndex, int targetSide)
{
    TPZGeoEl * gel = Mesh->ElementVec()[ElemIndex];
    
    #ifdef PZDEBUG
    if(!gel)
    {
        std::cout << "Null geoel on " << __PRETTY_FUNCTION__ << std::endl;
        DebugStop();
    }
    #endif
    
    if(gel->IsLinearMapping())
    {
        gel = TPZChangeEl::ChangeToQuadratic(Mesh, ElemIndex);
    }
    
    MElementType gelType = gel->Type();
    
    TPZStack<int> targetSideNodes, targetSideEdges;
    
    switch(gelType)
    {
        case (EPoint):
        {
            TPZPoint::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPoint::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EOned):
        {
            TPZLine::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZLine::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ETriangle):
        {
            TPZTriangle::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZTriangle::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EQuadrilateral):
        {
            TPZQuadrilateral::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZQuadrilateral::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ETetraedro):
        {
            TPZTetrahedron::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZTetrahedron::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EPiramide):
        {
            TPZPyramid::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPyramid::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EPrisma):
        {
            TPZPrism::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPrism::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ECube):
        {
            TPZCube::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZCube::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
        default:
        {
            std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
            DebugStop();
        }
    }
    
    std::set<int> targetSideNodes_set, targetSideEdges_set, NOTtargetSideEdges_set;
    TPZGeoElSide targetSideEl(gel,targetSide);
    for(int nd = 0; nd < targetSideNodes.NElements(); nd++)
    {
        int tsNode = targetSideNodes[nd];
        targetSideNodes_set.insert(tsNode);
    }
    if(targetSideEl.Dimension() == 0)
    {
        targetSideNodes_set.insert(targetSide);
    }
    for(int ed = 0; ed < targetSideEdges.NElements(); ed++)
    {
        int tsEdge = targetSideEdges[ed];
        targetSideEdges_set.insert(tsEdge);
    }
    if(targetSideEl.Dimension() == 1)
    {
        targetSideEdges_set.insert(targetSide);
    }
    for(int sd = gel->NCornerNodes(); sd < gel->NSides(); sd++)
    {
        TPZGeoElSide gelSide(gel,sd);
        if(gelSide.Dimension() == 1 && targetSideEdges_set.find(sd) == targetSideEdges_set.end())
        {
            NOTtargetSideEdges_set.insert(sd);
        }
        else if(gelSide.Dimension() > 1)
        {
            break;
        }
    }
    
    const REAL dist = 0.25;
    
    std::set<int>::iterator it;
    for(it = NOTtargetSideEdges_set.begin(); it != NOTtargetSideEdges_set.end(); it++)
    {
        int edg = *it;
        TPZGeoElSide gelSide(gel,edg);
        
        int64_t initNode = gelSide.SideNodeLocIndex(0);
        int64_t finalNode = gelSide.SideNodeLocIndex(1); 
        int64_t meshInitNode = gelSide.SideNodeIndex(0);
        int64_t meshFinalNode = gelSide.SideNodeIndex(1);
        /**
         * Embora o elemento quadratico possua mais nohs (NNodes), a topologia segue igual ao
         * elemento linear no qual o elemento quadratico foi baseado.
         *
         * Isso quer dizer que Linear(Geom::NNodes) < Quadratic(Geom::NNodes), mas Linear(Geom::NSides) = Quadratic(Geom::NSides)
         *
         * Com isso a numeracao dos nohs nos meios das arestas coincide com a numeracao dos lados unidimensionais do elemento.
         */
        int64_t meshMiddleNode = gel->NodeIndex(edg);
        //********************
                                            
        double coordNear, coordFar;
        
        if(targetSideNodes_set.find(initNode) != targetSideNodes_set.end())//drag middle node to node 0 of this edge
        {
            for(int c = 0; c < 3; c++)
            {
                coordNear = Mesh->NodeVec()[meshInitNode].Coord(c);
                coordFar = Mesh->NodeVec()[meshFinalNode].Coord(c);
                Mesh->NodeVec()[meshMiddleNode].SetCoord(c, (1. - dist)*coordNear + (dist)*coordFar);
            }
        }
        else if(targetSideNodes_set.find(finalNode) != targetSideNodes_set.end())//drag middle node to node 1 of this edge
        {
            for(int c = 0; c < 3; c++)
            {
                coordNear = Mesh->NodeVec()[meshFinalNode].Coord(c);
                coordFar = Mesh->NodeVec()[meshInitNode].Coord(c);
                Mesh->NodeVec()[meshMiddleNode].SetCoord(c, (1. - dist)*coordNear + (dist)*coordFar);
            }
        }
    }				
    
    return gel;
}